

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf_reader.c
# Opt level: O2

int satoko_parse_dimacs(char *fname,satoko_t **solver)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  long lVar5;
  char *pcVar6;
  void *pvVar7;
  ushort **ppuVar8;
  uint *__ptr;
  uint uVar9;
  ulong uVar10;
  char *token;
  satoko_t *local_48;
  char *local_40;
  satoko_t **local_38;
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Couldn\'t open file: %s\n",fname);
LAB_0046e4fb:
    iVar3 = -1;
  }
  else {
    __ptr = (uint *)0x0;
    local_38 = solver;
    fseek(__stream,0,2);
    lVar5 = ftell(__stream);
    rewind(__stream);
    pcVar6 = (char *)malloc((lVar5 << 0x20) + 0x300000000 >> 0x20);
    fread(pcVar6,(long)(int)lVar5,1,__stream);
    pcVar6[(int)lVar5] = '\n';
    pcVar6[(lVar5 << 0x20) + 0x100000000 >> 0x20] = '\0';
    local_48 = (satoko_t *)0x0;
    token = pcVar6;
    local_40 = pcVar6;
    do {
      while( true ) {
        while( true ) {
          skip_spaces(&token);
          cVar1 = *token;
          if (cVar1 != 'c') break;
          skip_line(&token);
        }
        if (cVar1 == '\0') {
          free(*(void **)(__ptr + 2));
          free(__ptr);
          free(local_40);
          *local_38 = local_48;
          return 1;
        }
        if (cVar1 != 'p') break;
        token = token + 1;
        skip_spaces(&token);
        ppuVar8 = __ctype_b_loc();
        pcVar6 = token;
        do {
          token = pcVar6;
          pcVar6 = token + 1;
        } while ((*(byte *)((long)*ppuVar8 + (long)*token * 2 + 1) & 0x20) == 0);
        uVar4 = read_int(&token);
        read_int(&token);
        skip_line(&token);
        __ptr = (uint *)malloc(0x10);
        if (uVar4 - 1 < 0xf) {
          uVar4 = 0x10;
        }
        __ptr[1] = 0;
        *__ptr = uVar4;
        if (uVar4 == 0) {
          pvVar7 = (void *)0x0;
        }
        else {
          pvVar7 = malloc((ulong)uVar4 << 2);
        }
        *(void **)(__ptr + 2) = pvVar7;
        local_48 = satoko_create();
      }
      if (__ptr == (uint *)0x0) {
        puts("There is no parameter line.");
        free(local_40);
        goto LAB_0046e4fb;
      }
      uVar4 = 0;
      while( true ) {
        __ptr[1] = uVar4;
        iVar3 = read_int(&token);
        if (iVar3 == 0) break;
        iVar2 = -iVar3;
        if (0 < iVar3) {
          iVar2 = iVar3;
        }
        uVar4 = __ptr[1];
        if (uVar4 == *__ptr) {
          uVar9 = uVar4 * 2;
          if (uVar4 < 0x10) {
            uVar9 = 0x10;
          }
          pvVar7 = *(void **)(__ptr + 2);
          if (uVar4 < uVar9) {
            pvVar7 = realloc(pvVar7,(ulong)uVar9 << 2);
            *(void **)(__ptr + 2) = pvVar7;
            if (pvVar7 == (void *)0x0) {
              __assert_fail("p->data != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                            ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
            }
            *__ptr = uVar9;
            uVar4 = __ptr[1];
          }
        }
        else {
          pvVar7 = *(void **)(__ptr + 2);
        }
        *(uint *)((long)pvVar7 + (ulong)uVar4 * 4) = (uint)(iVar3 < 1) + iVar2 * 2 + -2;
        uVar4 = __ptr[1] + 1;
      }
      iVar3 = satoko_add_clause(local_48,*(int **)(__ptr + 2),__ptr[1]);
    } while (iVar3 != 0);
    printf("Unable to add clause: ");
    fprintf(_stdout,"Vector has %u(%u) entries: {",(ulong)__ptr[1],(ulong)*__ptr);
    for (uVar10 = 0; uVar10 < __ptr[1]; uVar10 = uVar10 + 1) {
      fprintf(_stdout," %u",(ulong)*(uint *)(*(long *)(__ptr + 2) + uVar10 * 4));
    }
    fwrite(" }\n",3,1,_stdout);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int satoko_parse_dimacs(char *fname, satoko_t **solver)
{
    satoko_t *p = NULL;
    vec_uint_t *lits = NULL;
    int n_var;
    int n_clause;
    char *buffer = file_open(fname);
    char *token;

    if (buffer == NULL)
        return -1;

    token = buffer;
    while (1) {
        skip_spaces(&token);
        if (*token == 0)
            break;
        else if (*token == 'c')
            skip_line(&token);
        else if (*token == 'p') {
            token++;
            skip_spaces(&token);
            for(; !isspace(*token); token++); /* skip 'cnf' */

            n_var = read_int(&token);
            n_clause = read_int(&token);
            skip_line(&token);
            lits = vec_uint_alloc((unsigned) n_var);
            p = satoko_create();
        } else {
            if (lits == NULL) {
                printf("There is no parameter line.\n");
                satoko_free(buffer);
                return -1;
            }
            read_clause(&token, lits);
            if (!satoko_add_clause(p, (int*)vec_uint_data(lits), vec_uint_size(lits))) {
                printf("Unable to add clause: ");
                vec_uint_print(lits);
                return SATOKO_ERR;
            }
            }
    }
    vec_uint_free(lits);
    satoko_free(buffer);
    *solver = p;
    return SATOKO_OK;
}